

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.cpp
# Opt level: O0

void __thiscall
spvtools::utils::anon_unknown_11::ErrorMsgStream::~ErrorMsgStream(ErrorMsgStream *this)

{
  bool bVar1;
  string local_30 [32];
  ErrorMsgStream *local_10;
  ErrorMsgStream *this_local;
  
  local_10 = this;
  if ((this->error_msg_sink_ != (string *)0x0) &&
     (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this), bVar1)) {
    std::
    unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->(&this->stream_);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)this->error_msg_sink_,local_30);
    std::__cxx11::string::~string(local_30);
  }
  std::
  unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&this->stream_);
  return;
}

Assistant:

~ErrorMsgStream() {
    if (error_msg_sink_ && stream_) *error_msg_sink_ = stream_->str();
  }